

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Expression *curr)

{
  CostAnalyzer local_28;
  Index local_24;
  Expression *pEStack_20;
  CostType cost;
  Expression *curr_local;
  PassOptions *passOptions_local;
  
  if (passOptions->shrinkLevel < 2) {
    pEStack_20 = curr;
    curr_local = (Expression *)passOptions;
    CostAnalyzer::CostAnalyzer(&local_28,curr);
    local_24 = local_28.cost;
    passOptions_local._7_1_ = tooCostlyToRunUnconditionally((PassOptions *)curr_local,local_28.cost)
    ;
  }
  else {
    passOptions_local._7_1_ = false;
  }
  return passOptions_local._7_1_;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Expression* curr) {
  // If we care entirely about code size, just do it for that reason (early
  // exit to avoid work).
  if (passOptions.shrinkLevel >= 2) {
    return false;
  }
  auto cost = CostAnalyzer(curr).cost;
  return tooCostlyToRunUnconditionally(passOptions, cost);
}